

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_fchang_2003.h
# Opt level: O3

Point2i __thiscall CT::Tracer(CT *this,Point2i *p,int *i_prev,bool *b_isolated)

{
  Point2i PVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  undefined1 *in_R8;
  int iVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  
  iVar4 = *(int *)b_isolated;
  uVar3 = iVar4 + 9;
  if (-1 < (int)(iVar4 + 2U)) {
    uVar3 = iVar4 + 2U;
  }
  iVar5 = (iVar4 - (uVar3 & 0xfffffff8)) + 2;
  uVar6 = 0;
  uVar3 = 0;
  iVar4 = iVar5;
  do {
    switch(iVar4) {
    case 0:
      uVar3 = i_prev[1];
      uVar6 = *i_prev + 1;
      break;
    case 1:
      iVar2 = i_prev[1];
      uVar6 = *i_prev + 1;
      goto LAB_0018f398;
    case 2:
      uVar6 = *i_prev;
      iVar2 = i_prev[1];
      goto LAB_0018f398;
    case 3:
      iVar2 = i_prev[1];
      uVar6 = *i_prev - 1;
LAB_0018f398:
      uVar3 = iVar2 + 1;
      break;
    case 4:
      uVar3 = i_prev[1];
      uVar6 = *i_prev - 1;
      break;
    case 5:
      iVar2 = i_prev[1];
      uVar6 = *i_prev - 1;
      goto LAB_0018f3ad;
    case 6:
      uVar6 = *i_prev;
      iVar2 = i_prev[1];
      goto LAB_0018f3ad;
    case 7:
      iVar2 = i_prev[1];
      uVar6 = *i_prev + 1;
LAB_0018f3ad:
      uVar3 = iVar2 - 1;
    }
    if ((((-1 < (int)uVar3) && (-1 < (int)uVar6)) &&
        (PVar1 = p[0xc], (int)uVar3 < *(int *)((long)PVar1 + 8))) &&
       ((int)uVar6 < *(int *)((long)PVar1 + 0xc))) {
      lVar8 = (ulong)uVar3 * **(long **)((long)PVar1 + 0x48) + *(long *)((long)PVar1 + 0x10);
      if (*(char *)((ulong)uVar6 + lVar8) == (char)p[0xe].y) {
        uVar7 = iVar4 + 0xb;
        if (-1 < (int)(iVar4 + 4U)) {
          uVar7 = iVar4 + 4U;
        }
        *(uint *)b_isolated = (iVar4 - (uVar7 & 0xfffffff8)) + 4;
        *(uint *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling._vptr_Labeling =
             uVar6;
        *(uint *)((long)&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.
                         _vptr_Labeling + 4) = uVar3;
        return (Point2i)this;
      }
      *(undefined1 *)(lVar8 + (ulong)uVar6) = 0xff;
    }
    uVar7 = iVar4 + 8;
    if (-1 < (int)(iVar4 + 1U)) {
      uVar7 = iVar4 + 1U;
    }
    iVar4 = (iVar4 - (uVar7 & 0xfffffff8)) + 1;
    if (iVar4 == iVar5) {
      *in_R8 = 1;
      (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling._vptr_Labeling =
           *(_func_int ***)i_prev;
      return (Point2i)this;
    }
  } while( true );
}

Assistant:

cv::Point2i Tracer(const cv::Point2i &p, int &i_prev, bool &b_isolated) {
        int i_first, i_next;

        // Find the direction to be analyzed
        i_first = i_next = (i_prev + 2) % 8;

        cv::Point2i crd_next;
        do {
            switch (i_next) {
            case 0: crd_next = p + cv::Point2i(1, 0); break;
            case 1: crd_next = p + cv::Point2i(1, 1); break;
            case 2: crd_next = p + cv::Point2i(0, 1); break;
            case 3: crd_next = p + cv::Point2i(-1, 1); break;
            case 4: crd_next = p + cv::Point2i(-1, 0); break;
            case 5: crd_next = p + cv::Point2i(-1, -1); break;
            case 6: crd_next = p + cv::Point2i(0, -1); break;
            case 7: crd_next = p + cv::Point2i(1, -1); break;
            }

            if (crd_next.y >= 0 && crd_next.x >= 0 && crd_next.y < img_.rows && crd_next.x < img_.cols) {
                if (img_.data[crd_next.y * img_.step[0] + crd_next.x] == byF) {
                    i_prev = (i_next + 4) % 8;
                    return crd_next;
                }
                else
					img_.data[crd_next.y * img_.step[0] + crd_next.x] = -1;
            }

            i_next = (i_next + 1) % 8;
        } while (i_next != i_first);

        b_isolated = true;
        return p;
    }